

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void vector_suite::test_int_one(void)

{
  vector<int,_std::allocator<int>_> value;
  oarchive ar;
  ostringstream result;
  _Vector_base<int,_std::allocator<int>_> local_228;
  int local_208 [8];
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208[0] = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_228,local_208);
  trial::protocol::json::basic_oarchive<char>::save_override<std::vector<int,std::allocator<int>>>
            (&local_1e8,(vector<int,_std::allocator<int>_> *)&local_228);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"[1]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x1c3,"void vector_suite::test_int_one()",local_208,"[1]");
  std::__cxx11::string::~string((string *)local_208);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_228);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_int_one()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::vector<int> value;
    value.push_back(1);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1]");
}